

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSGetNumMassMatvecSetups(void *arkode_mem,long *nmvsetups)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMassMatvecSetups",&local_10,&local_18);
  if (iVar1 == 0) {
    *nmvsetups = local_18->nmvsetup;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMassMatvecSetups(void *arkode_mem, long int *nmvsetups)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassMatvecSetups",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmvsetups = arkls_mem->nmvsetup;
  return(ARKLS_SUCCESS);
}